

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
* __thiscall
fmt::v7::
make_args_checked<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,char[10],char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
           *__return_storage_ptr__,v7 *this,char (*format_str) [10],
          remove_reference_t<std::basic_string_view<char>_> *args,
          remove_reference_t<unsigned_long> *args_1)

{
  remove_reference_t<unsigned_long> *args_local_1;
  remove_reference_t<std::basic_string_view<char>_> *args_local;
  char (*format_str_local) [10];
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  ::format_arg_store(__return_storage_ptr__,
                     (basic_string_view<char,_std::char_traits<char>_> *)format_str,&args->_M_len);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}